

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

find_result __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::find_child(basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             *this,node_type type,byte key_byte)

{
  unsigned_long uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint8_t key_int_byte;
  uint uVar6;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *pkVar7;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *pkVar8;
  undefined7 in_register_00000031;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  find_result fVar11;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    __assert_fail("type != node_type::LEAF",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x391,
                  "find_result unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::find_child(node_type, std::byte) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  case 1:
    auVar9[1] = key_byte;
    auVar9[0] = key_byte;
    auVar9[2] = key_byte;
    auVar9[3] = key_byte;
    auVar9[4] = key_byte;
    auVar9[5] = key_byte;
    auVar9[6] = key_byte;
    auVar9[7] = key_byte;
    auVar9[8] = key_byte;
    auVar9[9] = key_byte;
    auVar9[10] = key_byte;
    auVar9[0xb] = key_byte;
    auVar9[0xc] = key_byte;
    auVar9[0xd] = key_byte;
    auVar9[0xe] = key_byte;
    auVar9[0xf] = key_byte;
    auVar10 = vpcmpeqb_avx(auVar9,ZEXT416(*(uint *)&this->field_0xc));
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) &
            ~(-1 << ((this->children_count).value & 0x1f));
    uVar2 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar3 = CONCAT31((int3)(-(uint)(uVar6 == 0) >> 8),(byte)-(uint)(uVar6 == 0) | (byte)uVar2);
    pkVar7 = &this[1].k_prefix + uVar2;
    break;
  case 2:
    auVar10[1] = key_byte;
    auVar10[0] = key_byte;
    auVar10[2] = key_byte;
    auVar10[3] = key_byte;
    auVar10[4] = key_byte;
    auVar10[5] = key_byte;
    auVar10[6] = key_byte;
    auVar10[7] = key_byte;
    auVar10[8] = key_byte;
    auVar10[9] = key_byte;
    auVar10[10] = key_byte;
    auVar10[0xb] = key_byte;
    auVar10[0xc] = key_byte;
    auVar10[0xd] = key_byte;
    auVar10[0xe] = key_byte;
    auVar10[0xf] = key_byte;
    auVar10 = vpcmpeqb_avx(auVar10,(undefined1  [16])this[1]);
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) &
            ~(-1 << ((this->children_count).value & 0x1f));
    uVar2 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar3 = CONCAT31((int3)(-(uint)(uVar6 == 0) >> 8),(byte)-(uint)(uVar6 == 0) | (byte)uVar2);
    pkVar7 = &this[2].k_prefix + uVar2;
    break;
  case 3:
    uVar5 = (ulong)key_byte;
    pkVar8 = &this[0x12].k_prefix + (byte)(&this->field_0x9)[uVar5];
    if ((&this->field_0x9)[uVar5] == 0xff) {
      uVar5 = 0xff;
      pkVar8 = (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                *)0x0;
    }
    goto LAB_00209f37;
  case 4:
    uVar1 = (&this[1].k_prefix)[key_byte].u64.value;
    iVar4 = -(uint)(uVar1 == 0);
    uVar5 = (ulong)CONCAT31((int3)((uint)iVar4 >> 8),(byte)iVar4 | key_byte);
    pkVar8 = &this[1].k_prefix + key_byte;
    if (uVar1 == 0) {
      pkVar8 = (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                *)0x0;
    }
    goto LAB_00209f37;
  default:
    basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
    ::find_child();
  }
  uVar5 = (ulong)uVar3;
  pkVar8 = (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
            *)0x0;
  if (uVar6 != 0) {
    pkVar8 = pkVar7;
  }
LAB_00209f37:
  fVar11.second =
       (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *)
       pkVar8;
  fVar11._0_8_ = uVar5;
  return fVar11;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr find_result find_child(
      node_type type, std::byte key_byte) noexcept {
    UNODB_DETAIL_ASSERT(type != node_type::LEAF);
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->find_child(key_byte);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->find_child(key_byte);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->find_child(key_byte);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->find_child(key_byte);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }